

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmBase.cpp
# Opt level: O2

int __thiscall AlgorithmBase::ColourDifference(AlgorithmBase *this,QRgb a,QRgb b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (double)(int)((a & 0xff) - (b & 0xff));
  dVar3 = (double)(int)((a >> 8 & 0xff) - (b >> 8 & 0xff));
  dVar2 = (double)(int)((a >> 0x10 & 0xff) - (b >> 0x10 & 0xff));
  return (int)(dVar2 * dVar2 + dVar3 * dVar3 + dVar1 * dVar1);
}

Assistant:

int AlgorithmBase::ColourDifference(QRgb a, QRgb b) const
{
    int bDiff = qBlue(a) - qBlue(b);
    int gDiff = qGreen(a) - qGreen(b);
    int rDiff = qRed(a) - qRed(b);

    /*
     * std::pow ensures each difference is positive, and also places an emphasis
     * on minimising the difference accross all colours.
     *
     * MAYBE A greater emphasis could be placed on green as the human eye
     * percieves the most luminosity in the green channel.
     */
    return std::pow(bDiff, 2) + std::pow(gDiff, 2) + std::pow(rDiff, 2);
}